

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sketch_impl.h
# Opt level: O0

void PolyMod<(anonymous_namespace)::Field<unsigned_int,32,141u,RecLinTrans<unsigned_int,6,6,5,5,5,5>,RecLinTrans<unsigned_int,4,4,4,4,4,4,4,4>,&(anonymous_namespace)::SQR_TABLE_32,&(anonymous_namespace)::QRT_TABLE_32>>
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *mod,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *val,
               Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
               *field)

{
  value_type vVar1;
  long lVar2;
  size_type sVar3;
  size_type sVar4;
  reference pvVar5;
  Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
  *in_RSI;
  long in_FS_OFFSET;
  size_t x;
  value_type term;
  size_t modsize;
  Multiplier mul;
  undefined4 in_stack_fffffffffffffda8;
  uint in_stack_fffffffffffffdac;
  uint uVar6;
  Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
  *in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb8;
  Elem in_stack_fffffffffffffdbc;
  ulong local_238;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
  sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
  if (sVar3 <= sVar4) {
    while (sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                              CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8)),
          sVar3 <= sVar4) {
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::back
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
      vVar1 = *pvVar5;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::pop_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
      if (vVar1 != 0) {
        anon_unknown.dwarf_250df77::
        Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
        ::Multiplier::Multiplier
                  ((Multiplier *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                   in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac);
        for (local_238 = 0;
            sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                               CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8)),
            local_238 < sVar4 - 1; local_238 = local_238 + 1) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                     (size_type)in_stack_fffffffffffffdb0);
          in_stack_fffffffffffffdbc =
               anon_unknown.dwarf_250df77::
               Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
               ::Multiplier::operator()
                         ((Multiplier *)
                          CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),0);
          in_stack_fffffffffffffdb0 = in_RSI;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
          pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                              CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                              (size_type)in_stack_fffffffffffffdb0);
          *pvVar5 = in_stack_fffffffffffffdbc ^ *pvVar5;
        }
      }
    }
    while( true ) {
      sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
      uVar6 = in_stack_fffffffffffffdac & 0xffffff;
      if (sVar3 != 0) {
        pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::back
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                            (CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8) &
                            0xffffffffffffff));
        uVar6 = CONCAT13(*pvVar5 == 0,(int3)uVar6);
      }
      in_stack_fffffffffffffdac = uVar6;
      if ((char)(in_stack_fffffffffffffdac >> 0x18) == '\0') break;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::pop_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void PolyMod(const std::vector<typename F::Elem>& mod, std::vector<typename F::Elem>& val, const F& field) {
    size_t modsize = mod.size();
    CHECK_SAFE(modsize > 0 && mod.back() == 1);
    if (val.size() < modsize) return;
    CHECK_SAFE(val.back() != 0);
    while (val.size() >= modsize) {
        auto term = val.back();
        val.pop_back();
        if (term != 0) {
            typename F::Multiplier mul(field, term);
            for (size_t x = 0; x < mod.size() - 1; ++x) {
                val[val.size() - modsize + 1 + x] ^= mul(mod[x]);
            }
        }
    }
    while (val.size() > 0 && val.back() == 0) val.pop_back();
}